

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::trunc_tmp(SSPMSolver *this,int pindex)

{
  ulong *puVar1;
  int *piVar2;
  uint64_t *puVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  piVar2 = this->tmp_d;
  if ((*piVar2 != -1) && (0 < (long)this->l)) {
    puVar3 = (this->tmp_b)._bits;
    uVar7 = (long)this->l;
    do {
      uVar6 = uVar7 - 1;
      if (piVar2[uVar6] <= pindex) {
        return;
      }
      bVar5 = (byte)uVar6 & 0x3f;
      puVar1 = puVar3 + (uVar6 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      piVar2[uVar6] = pindex + 1;
      bVar4 = 1 < uVar7;
      uVar7 = uVar6;
    } while (bVar4);
  }
  return;
}

Assistant:

void
SSPMSolver::trunc_tmp(int pindex)
{
    if (tmp_d[0] == -1) return; // already Top
    // compute the lowest pindex >= p
    // [pindex],.,...,.. => [pindex],000
    // if pindex is the bottom, then this simply "buries" the remainder
    for (int i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
        tmp_b[i] = 0;
        tmp_d[i] = pindex+1;
    }
}